

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void Map_Remove(Map *tree,void *str,size_t size)

{
  Map *data;
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Stack stk;
  byte local_41;
  Stack local_40;
  
  Stack_Init(&local_40);
  local_41 = *str;
  Stack_Push(&local_40,tree);
  lVar2 = size - 1;
  if (lVar2 == 0) {
    lVar4 = 0;
  }
  else {
    lVar3 = 0;
    do {
      data = tree->delta[*(byte *)((long)str + lVar3)];
      lVar4 = lVar3;
      if (data == (Map *)0x0) break;
      if (data->is_final == '\x01') {
        while (local_40.size != 0) {
          Stack_Pop(&local_40);
        }
        local_41 = *(byte *)((long)str + lVar3 + 1);
      }
      Stack_Push(&local_40,data);
      lVar3 = lVar3 + 1;
      lVar4 = lVar2;
      tree = data;
    } while (lVar3 != lVar2);
  }
  if (tree->delta[*(byte *)((long)str + lVar4)] != (Map *)0x0) {
    free(tree->delta[*(byte *)((long)str + lVar4)]);
    if (1 < local_40.size) {
      do {
        pvVar1 = Stack_Pop(&local_40);
        free(pvVar1);
      } while (1 < local_40.size);
    }
    pvVar1 = Stack_Pop(&local_40);
    *(undefined8 *)((long)pvVar1 + (ulong)local_41 * 8 + 8) = 0;
  }
  return;
}

Assistant:

void Map_Remove(Map *tree, void *str,size_t size)
{
	Stack stk;
	Stack_Init(&stk);
	size_t where;
	char what_to_null=((char*)str)[0];

	Stack_Push(&stk,tree);

	for(where=0;where<size-1 && tree->delta[((unsigned char*)str)[where]]!=NULL;++where)
	{
		tree = tree->delta[((unsigned char*)str)[where]];
		if(tree->is_final==1)
		{
			while(stk.size>0)Stack_Pop(&stk);
			what_to_null=((char*)str)[where+1];
		}
		Stack_Push(&stk,tree);
	}
	if(tree->delta[((unsigned char*)str)[where]] == NULL)return;
	free(tree->delta[((unsigned char*)str)[where]]);
	while(stk.size>1)free(Stack_Pop(&stk));
	tree=(Map*)Stack_Pop(&stk);
	tree->delta[(unsigned char)what_to_null]=NULL;
	
}